

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

shared_ptr<const_pstore::index::details::internal_node> __thiscall
pstore::index::details::internal_node::read_node
          (internal_node *this,database *db,
          typed_address<pstore::index::details::internal_node> addr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> addr_00;
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  hash_type hVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_pstore::index::details::internal_node> sVar5;
  string local_c8;
  database *local_a8;
  value_type local_a0;
  undefined1 local_98 [32];
  size_t actual_size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  shared_ptr<const_pstore::index::details::internal_node> base;
  database *db_local;
  typed_address<pstore::index::details::internal_node> addr_local;
  shared_ptr<const_pstore::index::details::internal_node> *resl;
  
  base.super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)db;
  db_local = (database *)addr.a_.a_;
  addr_local.a_.a_ = (address)(address)this;
  local_48._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       typed_address<pstore::index::details::internal_node>::to_address
                 ((typed_address<pstore::index::details::internal_node> *)&db_local);
  database::getro((database *)local_40,(address)db,(size_t)local_48._M_pi);
  std::static_pointer_cast<pstore::index::details::internal_node_const,void_const>
            ((shared_ptr<const_void> *)local_30);
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)local_40);
  peVar3 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  hVar4 = get_bitmap(peVar3);
  if (hVar4 == 0) {
    database::path_abi_cxx11_
              ((string *)&stack0xffffffffffffff98,
               (database *)
               base.
               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    raise<pstore::error_code,std::__cxx11::string>
              (index_corrupt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff98);
  }
  peVar3 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  uVar2 = size(peVar3);
  local_98._24_8_ = size_bytes((ulong)uVar2);
  std::__shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              *)local_30);
  addr_00 = base.
            super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  if ((ulong)local_98._24_8_ < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x11) {
    assert_failed("actual_size > sizeof (internal_node) - sizeof (internal_node::children_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x110);
  }
  local_98[0x17] = 0;
  local_a0 = (value_type)
             typed_address<pstore::index::details::internal_node>::to_address
                       ((typed_address<pstore::index::details::internal_node> *)&db_local);
  database::getro((database *)local_98,(address)addr_00._M_pi,local_a0);
  std::static_pointer_cast<pstore::index::details::internal_node_const,void_const>
            ((shared_ptr<const_void> *)this);
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)local_98);
  peVar3 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  local_a8 = db_local;
  bVar1 = validate_after_load(peVar3,(typed_address<pstore::index::details::internal_node>)db_local)
  ;
  if (bVar1) {
    local_98[0x17] = 1;
    std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
              ((shared_ptr<const_pstore::index::details::internal_node> *)local_30);
    sVar5.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar5.
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = this;
    return (shared_ptr<const_pstore::index::details::internal_node>)
           sVar5.
           super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  database::path_abi_cxx11_
            (&local_c8,
             (database *)
             base.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  raise<pstore::error_code,std::__cxx11::string>(index_corrupt,&local_c8);
}

Assistant:

auto internal_node::read_node (database const & db,
                                           typed_address<internal_node> const addr)
                -> std::shared_ptr<internal_node const> {
                /// Sadly, loading an internal_node needs to done in three stages:
                /// 1. Load the basic structure
                /// 2. Calculate the actual size of the child pointer array
                /// 3. Load the complete structure along with its child pointer array
                auto base = std::static_pointer_cast<internal_node const> (
                    db.getro (addr.to_address (),
                              sizeof (internal_node) - sizeof (internal_node::children_)));

                if (base->get_bitmap () == 0) {
                    raise (error_code::index_corrupt, db.path ());
                }
                std::size_t const actual_size = internal_node::size_bytes (base->size ());
                base.reset ();

                PSTORE_ASSERT (actual_size >
                               sizeof (internal_node) - sizeof (internal_node::children_));
                auto resl = std::static_pointer_cast<internal_node const> (
                    db.getro (addr.to_address (), actual_size));

                if (!validate_after_load (*resl, addr)) {
                    raise (error_code::index_corrupt, db.path ());
                }

                return resl;
            }